

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

bool kratos::MixedAssignmentVisitor::has_non_port(Generator *context,Var *var)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  long *plVar4;
  
  if (var == (Var *)0x0) {
    return false;
  }
  do {
    if (var->type_ == Slice) {
      lVar3 = __dynamic_cast(var,&Var::typeinfo,&VarSlice::typeinfo,0);
      plVar4 = (long *)(lVar3 + 0x270);
    }
    else {
      if (var->type_ != Expression) {
        iVar2 = (*(var->super_IRNode)._vptr_IRNode[0xd])(var);
        if ((Generator *)CONCAT44(extraout_var,iVar2) == context) {
          return false;
        }
        return var->type_ - Parameter < 0xfffffffe;
      }
      lVar3 = __dynamic_cast(var,&Var::typeinfo,&Expr::typeinfo,0);
      bVar1 = has_non_port(context,*(Var **)(lVar3 + 0x278));
      if (bVar1) {
        return true;
      }
      plVar4 = (long *)(lVar3 + 0x280);
    }
    var = (Var *)*plVar4;
    if (var == (Var *)0x0) {
      return false;
    }
  } while( true );
}

Assistant:

static bool has_non_port(Generator* context, Var* var) {
        if (!var) return false;
        if (var->type() == VarType::Expression) {
            auto* expr = dynamic_cast<Expr*>(var);
            return has_non_port(context, expr->left) || has_non_port(context, expr->right);
        } else if (var->type() == VarType::Slice) {
            auto* slice = dynamic_cast<VarSlice*>(var);
            return has_non_port(context, slice->parent_var);
        } else {
            return var->generator() != context && var->type() != VarType::PortIO &&
                   var->type() != VarType ::ConstValue;
        }
    }